

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vauth.c
# Opt level: O0

_Bool Curl_auth_allowed_to_host(Curl_easy *data)

{
  connectdata *pcVar1;
  int iVar2;
  _Bool local_1a;
  _Bool local_19;
  connectdata *conn;
  Curl_easy *data_local;
  
  pcVar1 = data->conn;
  local_19 = true;
  if (((*(uint *)&(data->state).field_0x774 >> 1 & 1) != 0) &&
     (local_19 = true, (*(ulong *)&(data->set).field_0x8ca >> 0x17 & 1) == 0)) {
    local_1a = false;
    if ((data->state).first_host != (char *)0x0) {
      iVar2 = curl_strequal((data->state).first_host,(pcVar1->host).name);
      local_1a = false;
      if ((iVar2 != 0) && (local_1a = false, (data->state).first_remote_port == pcVar1->remote_port)
         ) {
        local_1a = (data->state).first_remote_protocol == pcVar1->handler->protocol;
      }
    }
    local_19 = local_1a;
  }
  return local_19;
}

Assistant:

bool Curl_auth_allowed_to_host(struct Curl_easy *data)
{
  struct connectdata *conn = data->conn;
  return (!data->state.this_is_a_follow ||
          data->set.allow_auth_to_other_hosts ||
          (data->state.first_host &&
           strcasecompare(data->state.first_host, conn->host.name) &&
           (data->state.first_remote_port == conn->remote_port) &&
           (data->state.first_remote_protocol == conn->handler->protocol)));
}